

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall dxil_spv::Converter::Impl::get_type_id(Impl *this,Type *type,TypeLayoutFlags flags)

{
  bool bVar1;
  TypeID TVar2;
  uint uVar3;
  Id IVar4;
  uint uVar5;
  Builder *this_00;
  LoggingCallback p_Var6;
  void *pvVar7;
  uint64_t uVar8;
  SizeAlignment SVar9;
  VectorType *this_01;
  Type *pTVar10;
  int width_00;
  VectorType *vec_type;
  undefined1 local_10b0 [4];
  uint i;
  Vector<spv::Id> member_types;
  StructType *struct_type;
  uint32_t local_1088;
  Id local_1084;
  reference pAStack_1080;
  Id array_type_id;
  ArrayTypeEntry *cached_type;
  iterator __end4;
  iterator __begin4;
  Vector<ArrayTypeEntry> *__range4;
  uint32_t stride;
  SizeAlignment size_stride;
  Id element_type_id;
  Id array_size_id;
  Id pointee_type;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint width;
  Builder *builder;
  TypeLayoutFlags flags_local;
  Type *type_local;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  TVar2 = LLVMBC::Type::getTypeID(type);
  switch(TVar2) {
  case HalfTyID:
    bVar1 = support_native_fp16_operations(this);
    width_00 = 0x20;
    if (bVar1) {
      width_00 = 0x10;
    }
    this_local._4_4_ = spv::Builder::makeFloatType(this_00,width_00);
    break;
  case FloatTyID:
    this_local._4_4_ = spv::Builder::makeFloatType(this_00,0x20);
    break;
  case DoubleTyID:
    this_local._4_4_ = spv::Builder::makeFloatType(this_00,0x40);
    break;
  case IntegerTyID:
    uVar5 = LLVMBC::Type::getIntegerBitWidth(type);
    if (uVar5 == 1) {
      this_local._4_4_ = spv::Builder::makeBoolType(this_00);
    }
    else {
      uVar5 = LLVMBC::Type::getIntegerBitWidth(type);
      uVar5 = physical_integer_bit_width(uVar5);
      this_local._4_4_ = spv::Builder::makeIntegerType(this_00,uVar5,false);
    }
    break;
  case PointerTyID:
    uVar5 = LLVMBC::Type::getPointerAddressSpace(type);
    if (((char)uVar5 != '\x06') || ((flags & 1) == 0)) {
      p_Var6 = get_thread_log_callback();
      if (p_Var6 == (LoggingCallback)0x0) {
        fprintf(_stderr,
                "[ERROR]: Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n"
               );
        fflush(_stderr);
      }
      else {
        snprintf((char *)&array_size_id,0x1000,
                 "Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n"
                );
        pvVar7 = get_thread_log_callback_userdata();
        (*p_Var6)(pvVar7,Error,(char *)&array_size_id);
      }
      std::terminate();
    }
    pTVar10 = LLVMBC::Type::getPointerElementType(type);
    IVar4 = get_type_id(this,pTVar10,flags);
    this_local._4_4_ = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,IVar4);
    break;
  case ArrayTyID:
    uVar8 = LLVMBC::Type::getArrayNumElements(type);
    if (uVar8 == 0) {
      return 0;
    }
    if ((flags & 1) == 0) {
      pTVar10 = LLVMBC::Type::getArrayElementType(type);
      TVar2 = LLVMBC::Type::getTypeID(pTVar10);
      if (TVar2 != IntegerTyID) goto LAB_00140ec2;
      pTVar10 = LLVMBC::Type::getArrayElementType(type);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar10);
      if ((uVar5 != 8) || (uVar8 = LLVMBC::Type::getArrayNumElements(type), (uVar8 & 3) != 0))
      goto LAB_00140ec2;
      uVar8 = LLVMBC::Type::getArrayNumElements(type);
      size_stride.alignment = spv::Builder::makeUintConstant(this_00,(uint)(uVar8 >> 2),false);
      size_stride.size = spv::Builder::makeUintType(this_00,0x20);
    }
    else {
LAB_00140ec2:
      uVar8 = LLVMBC::Type::getArrayNumElements(type);
      size_stride.alignment = spv::Builder::makeUintConstant(this_00,(uint)uVar8,false);
      pTVar10 = LLVMBC::Type::getArrayElementType(type);
      size_stride.size = get_type_id(this,pTVar10,flags & 0xfffffff7);
    }
    if ((flags & 1) == 0) {
      this_local._4_4_ =
           spv::Builder::makeArrayType(this_00,size_stride.size,size_stride.alignment,0);
    }
    else {
      SVar9 = get_physical_size_for_type(this,size_stride.size);
      __range4._4_4_ = SVar9.size;
      __end4 = std::
               vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
               ::begin(&this->cached_physical_array_types);
      cached_type = (ArrayTypeEntry *)
                    std::
                    vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
                    ::end(&this->cached_physical_array_types);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<dxil_spv::Converter::Impl::ArrayTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>_>
                                         *)&cached_type), bVar1) {
        pAStack_1080 = __gnu_cxx::
                       __normal_iterator<dxil_spv::Converter::Impl::ArrayTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>_>
                       ::operator*(&__end4);
        if ((pAStack_1080->element_type_id == size_stride.size) &&
           (pAStack_1080->array_size_id == size_stride.alignment)) {
          return pAStack_1080->id;
        }
        __gnu_cxx::
        __normal_iterator<dxil_spv::Converter::Impl::ArrayTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>_>
        ::operator++(&__end4);
      }
      local_1084 = spv::Builder::makeArrayType
                             (this_00,size_stride.size,size_stride.alignment,__range4._4_4_);
      spv::Builder::addDecoration(this_00,local_1084,DecorationArrayStride,__range4._4_4_);
      struct_type._0_4_ = local_1084;
      struct_type._4_4_ = size_stride.size;
      local_1088 = size_stride.alignment;
      std::
      vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
      ::push_back(&this->cached_physical_array_types,(value_type *)&struct_type);
      this_local._4_4_ = local_1084;
    }
    break;
  case StructTyID:
    member_types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)LLVMBC::cast<LLVMBC::StructType>(type);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_10b0);
    uVar5 = LLVMBC::Type::getStructNumElements
                      ((Type *)member_types.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_10b0,
               (ulong)uVar5);
    for (vec_type._4_4_ = 0; uVar5 = vec_type._4_4_,
        uVar3 = LLVMBC::Type::getStructNumElements
                          ((Type *)member_types.
                                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage),
        uVar5 < uVar3; vec_type._4_4_ = vec_type._4_4_ + 1) {
      pTVar10 = LLVMBC::Type::getStructElementType
                          ((Type *)member_types.
                                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,vec_type._4_4_
                          );
      vec_type._0_4_ = get_type_id(this,pTVar10,flags & 0xfffffff7);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_10b0,
                 (value_type_conflict1 *)&vec_type);
    }
    this_local._4_4_ = get_struct_type(this,(Vector<spv::Id> *)local_10b0,flags,"");
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_10b0);
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case VectorTyID:
    this_01 = LLVMBC::cast<LLVMBC::VectorType>(type);
    pTVar10 = LLVMBC::VectorType::getElementType(this_01);
    IVar4 = get_type_id(this,pTVar10,0);
    uVar5 = LLVMBC::Type::getVectorNumElements(&this_01->super_Type);
    this_local._4_4_ = spv::Builder::makeVectorType(this_00,IVar4,uVar5);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id Converter::Impl::get_type_id(const llvm::Type *type, TypeLayoutFlags flags)
{
	auto &builder = spirv_module.get_builder();
	switch (type->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		return builder.makeFloatType(support_native_fp16_operations() ? 16 : 32);
	case llvm::Type::TypeID::FloatTyID:
		return builder.makeFloatType(32);
	case llvm::Type::TypeID::DoubleTyID:
		return builder.makeFloatType(64);

	case llvm::Type::TypeID::IntegerTyID:
		if (type->getIntegerBitWidth() == 1)
			return builder.makeBoolType();
		else
		{
			auto width = physical_integer_bit_width(type->getIntegerBitWidth());
			return builder.makeIntegerType(width, false);
		}

	case llvm::Type::TypeID::PointerTyID:
	{
		if (DXIL::AddressSpace(type->getPointerAddressSpace()) != DXIL::AddressSpace::PhysicalNodeIO ||
		    (flags & TYPE_LAYOUT_PHYSICAL_BIT) == 0)
		{
			// Have to deal with this from the outside. Should only be relevant for getelementptr and instructions like that.
			LOGE("Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n");
			std::terminate();
		}

		// This is free-flowing BDA in DXIL. We'll deal with it as-is.
		// Main complication is that we have to emit Offset information ourselves.
		spv::Id pointee_type = get_type_id(type->getPointerElementType(), flags);
		return builder.makePointer(spv::StorageClassPhysicalStorageBuffer, pointee_type);
	}

	case llvm::Type::TypeID::ArrayTyID:
	{
		if (type->getArrayNumElements() == 0)
			return 0;

		spv::Id array_size_id;
		spv::Id element_type_id;

		// dxbc2dxil emits broken code for TGSM. It's an array of i8 which is absolute nonsense.
		// It then bitcasts the pointer to i32, which isn't legal either.
		if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) == 0 &&
		    type->getArrayElementType()->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		    type->getArrayElementType()->getIntegerBitWidth() == 8 &&
		    type->getArrayNumElements() % 4 == 0)
		{
			array_size_id = builder.makeUintConstant(type->getArrayNumElements() / 4);
			element_type_id = builder.makeUintType(32);
		}
		else
		{
			array_size_id = builder.makeUintConstant(type->getArrayNumElements());
			element_type_id = get_type_id(type->getArrayElementType(), flags & ~TYPE_LAYOUT_BLOCK_BIT);
		}

		if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) != 0)
		{
			auto size_stride = get_physical_size_for_type(element_type_id);
			uint32_t stride = size_stride.size;

			// We always use scalar layout.
			for (auto &cached_type : cached_physical_array_types)
				if (cached_type.element_type_id == element_type_id && cached_type.array_size_id == array_size_id)
					return cached_type.id;

			spv::Id array_type_id = builder.makeArrayType(element_type_id, array_size_id, stride);
			builder.addDecoration(array_type_id, spv::DecorationArrayStride, stride);
			cached_physical_array_types.push_back({ array_type_id, element_type_id, array_size_id });
			return array_type_id;
		}
		else
		{
			// glslang emitter deduplicates.
			return builder.makeArrayType(element_type_id, array_size_id, 0);
		}
	}

	case llvm::Type::TypeID::StructTyID:
	{
		auto *struct_type = llvm::cast<llvm::StructType>(type);
		Vector<spv::Id> member_types;
		member_types.reserve(struct_type->getStructNumElements());
		for (unsigned i = 0; i < struct_type->getStructNumElements(); i++)
			member_types.push_back(get_type_id(struct_type->getStructElementType(i), flags & ~TYPE_LAYOUT_BLOCK_BIT));
		return get_struct_type(member_types, flags, "");
	}

	case llvm::Type::TypeID::VectorTyID:
	{
		auto *vec_type = llvm::cast<llvm::VectorType>(type);
		return builder.makeVectorType(get_type_id(vec_type->getElementType()), vec_type->getVectorNumElements());
	}

	default:
		return 0;
	}
}